

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int need_value(FuncState *fs,int list)

{
  Instruction *pIVar1;
  int in_ESI;
  FuncState *in_RDI;
  Instruction i;
  int local_14;
  
  local_14 = in_ESI;
  while( true ) {
    if (local_14 == -1) {
      return 0;
    }
    pIVar1 = getjumpcontrol(in_RDI,local_14);
    if ((*pIVar1 & 0x3f) != 0x1b) break;
    local_14 = getjump(in_RDI,local_14);
  }
  return 1;
}

Assistant:

static int need_value(FuncState*fs,int list){
for(;list!=(-1);list=getjump(fs,list)){
Instruction i=*getjumpcontrol(fs,list);
if(GET_OPCODE(i)!=OP_TESTSET)return 1;
}
return 0;
}